

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

COMMAND_QUEUE_TYPE Diligent::VkQueueFlagsToCmdQueueType(VkQueueFlags QueueFlags)

{
  COMMAND_QUEUE_TYPE CVar1;
  
  CVar1 = (COMMAND_QUEUE_TYPE)QueueFlags & COMMAND_QUEUE_TYPE_SPARSE_BINDING;
  if ((QueueFlags & 1) != 0) {
    return CVar1 | COMMAND_QUEUE_TYPE_GRAPHICS;
  }
  if ((QueueFlags & 2) == 0) {
    CVar1 = CVar1 | COMMAND_QUEUE_TYPE_TRANSFER;
    if ((QueueFlags & 4) == 0) {
      CVar1 = (COMMAND_QUEUE_TYPE)(QueueFlags & 4);
    }
    return CVar1;
  }
  return CVar1 | COMMAND_QUEUE_TYPE_COMPUTE;
}

Assistant:

COMMAND_QUEUE_TYPE VkQueueFlagsToCmdQueueType(VkQueueFlags QueueFlags)
{
    static_assert(COMMAND_QUEUE_TYPE_MAX_BIT == 0x7, "Please update the code below to handle the new context type");

    COMMAND_QUEUE_TYPE Result = COMMAND_QUEUE_TYPE_UNKNOWN;

    if (QueueFlags & VK_QUEUE_SPARSE_BINDING_BIT)
        Result |= COMMAND_QUEUE_TYPE_SPARSE_BINDING;

    if ((QueueFlags & VK_QUEUE_GRAPHICS_BIT) != 0)
        return Result | COMMAND_QUEUE_TYPE_GRAPHICS;

    if ((QueueFlags & VK_QUEUE_COMPUTE_BIT) != 0)
        return Result | COMMAND_QUEUE_TYPE_COMPUTE;

    if ((QueueFlags & VK_QUEUE_TRANSFER_BIT) != 0)
        return Result | COMMAND_QUEUE_TYPE_TRANSFER;

    return COMMAND_QUEUE_TYPE_UNKNOWN;
}